

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall Nova::Driver<float,_2>::Write_First_Frame(Driver<float,_2> *this,int frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string local_68;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  if (this->example->first_frame == frame) {
    File_Utilities::Create_Directory(&this->example->output_directory);
    paVar1 = &local_68.field_2;
    pcVar2 = (this->example->output_directory)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,
               pcVar2 + (this->example->output_directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    File_Utilities::Create_Directory(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pcVar2 = (this->example->output_directory)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,
               pcVar2 + (this->example->output_directory)._M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    __val = -frame;
    if (0 < frame) {
      __val = frame;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00127b37;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00127b37;
        }
        if (uVar5 < 10000) goto LAB_00127b37;
        uVar6 = uVar6 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00127b37:
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,(char)__len - (char)(frame >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_48 + ((uint)frame >> 0x1f),__len,__val);
    poVar4 = File_Utilities::Safe_Open_Output(&local_68,false);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_48,local_40);
    (**(code **)(*(long *)poVar4 + 8))(poVar4);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_First_Frame(const int frame) const
{
    if(frame==example.first_frame)
    {
        File_Utilities::Create_Directory(example.output_directory);
        File_Utilities::Create_Directory(example.output_directory+"/common");
        File_Utilities::Write_To_Text_File(example.output_directory+"/common/first_frame",std::to_string(frame));
    }
}